

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int copy_from_lzss_window(archive_read *a,void **buffer,int64_t startpos,int length)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  rar *rar;
  int firstpart;
  int windowoffs;
  int length_local;
  int64_t startpos_local;
  void **buffer_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  if (*(long *)((long)pvVar1 + 0xe0) == 0) {
    pvVar4 = malloc((ulong)*(uint *)((long)pvVar1 + 0xd8));
    *(void **)((long)pvVar1 + 0xe0) = pvVar4;
    if (pvVar4 == (void *)0x0) {
      archive_set_error(&a->archive,0xc,"Unable to allocate memory for uncompressed data.");
      return -0x1e;
    }
  }
  iVar2 = lzss_offset_for_position((lzss *)((long)pvVar1 + 0x348),startpos);
  iVar3 = lzss_size((lzss *)((long)pvVar1 + 0x348));
  if (iVar3 < iVar2 + length) {
    iVar3 = lzss_size((lzss *)((long)pvVar1 + 0x348));
    if (iVar3 < length) {
      archive_set_error(&a->archive,0x54,"Bad RAR file data");
      return -0x1e;
    }
    iVar3 = lzss_size((lzss *)((long)pvVar1 + 0x348));
    iVar3 = iVar3 - iVar2;
    if (iVar3 < 0) {
      archive_set_error(&a->archive,0x54,"Bad RAR file data");
      return -0x1e;
    }
    if (iVar3 < length) {
      memcpy((void *)(*(long *)((long)pvVar1 + 0xe0) + (ulong)*(uint *)((long)pvVar1 + 0xd4)),
             (void *)(*(long *)((long)pvVar1 + 0x348) + (long)iVar2),(long)iVar3);
      memcpy((void *)(*(long *)((long)pvVar1 + 0xe0) +
                     (ulong)(uint)(*(int *)((long)pvVar1 + 0xd4) + iVar3)),
             *(void **)((long)pvVar1 + 0x348),(long)(length - iVar3));
    }
    else {
      memcpy((void *)(*(long *)((long)pvVar1 + 0xe0) + (ulong)*(uint *)((long)pvVar1 + 0xd4)),
             (void *)(*(long *)((long)pvVar1 + 0x348) + (long)iVar2),(long)length);
    }
  }
  else {
    memcpy((void *)(*(long *)((long)pvVar1 + 0xe0) + (ulong)*(uint *)((long)pvVar1 + 0xd4)),
           (void *)(*(long *)((long)pvVar1 + 0x348) + (long)iVar2),(long)length);
  }
  *(int *)((long)pvVar1 + 0xd4) = length + *(int *)((long)pvVar1 + 0xd4);
  if (*(uint *)((long)pvVar1 + 0xd4) < *(uint *)((long)pvVar1 + 0xd8)) {
    *buffer = (void *)0x0;
  }
  else {
    *buffer = *(void **)((long)pvVar1 + 0xe0);
  }
  return 0;
}

Assistant:

static int
copy_from_lzss_window(struct archive_read *a, const void **buffer,
                        int64_t startpos, int length)
{
  int windowoffs, firstpart;
  struct rar *rar = (struct rar *)(a->format->data);

  if (!rar->unp_buffer)
  {
    if ((rar->unp_buffer = malloc(rar->unp_buffer_size)) == NULL)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Unable to allocate memory for uncompressed data.");
      return (ARCHIVE_FATAL);
    }
  }

  windowoffs = lzss_offset_for_position(&rar->lzss, startpos);
  if(windowoffs + length <= lzss_size(&rar->lzss)) {
    memcpy(&rar->unp_buffer[rar->unp_offset], &rar->lzss.window[windowoffs],
           length);
  } else if (length <= lzss_size(&rar->lzss)) {
    firstpart = lzss_size(&rar->lzss) - windowoffs;
    if (firstpart < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file data");
      return (ARCHIVE_FATAL);
    }
    if (firstpart < length) {
      memcpy(&rar->unp_buffer[rar->unp_offset],
             &rar->lzss.window[windowoffs], firstpart);
      memcpy(&rar->unp_buffer[rar->unp_offset + firstpart],
             &rar->lzss.window[0], length - firstpart);
    } else {
      memcpy(&rar->unp_buffer[rar->unp_offset],
             &rar->lzss.window[windowoffs], length);
    }
  } else {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file data");
      return (ARCHIVE_FATAL);
  }
  rar->unp_offset += length;
  if (rar->unp_offset >= rar->unp_buffer_size)
    *buffer = rar->unp_buffer;
  else
    *buffer = NULL;
  return (ARCHIVE_OK);
}